

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O1

DynamicSize *
slang::ast::dynamicBitstreamSize
          (DynamicSize *__return_storage_ptr__,Type *type,BitstreamSizeMode mode)

{
  int iVar1;
  int iVar2;
  Type *pTVar3;
  SyntaxNode *pSVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  bitwidth_t bVar10;
  BitstreamSizeMode BVar11;
  Type *pTVar12;
  ulong uVar13;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> sVar14;
  int iVar15;
  ClassPropertySymbol *prop;
  long lVar16;
  bool bVar17;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  sVar18;
  _Ct __m2;
  DynamicSize elemSize;
  unsigned_long local_50;
  DynamicSize local_48;
  
  bVar10 = Type::getBitWidth(type);
  uVar13 = (ulong)bVar10;
  if (bVar10 == 0) {
    if (type->canonical == (Type *)0x0) {
      Type::resolveCanonical(type);
    }
    if ((type->canonical->super_Symbol).kind == StringType) {
      __return_storage_ptr__->multiplier = (ulong)(mode != DestEmpty) << 3;
      __return_storage_ptr__->fixed = 0;
      goto LAB_00296762;
    }
    bVar9 = Type::isUnpackedArray(type);
    if (bVar9) {
      pTVar12 = Type::getArrayElementType(type);
      dynamicBitstreamSize(&local_48,pTVar12,mode);
      if (local_48.isValid == false) {
        *(ulong *)&__return_storage_ptr__->isValid = (ulong)(uint7)local_48._17_7_ << 8;
        __return_storage_ptr__->multiplier = local_48.multiplier;
        __return_storage_ptr__->fixed = local_48.fixed;
        return __return_storage_ptr__;
      }
      if (type->canonical == (Type *)0x0) {
        Type::resolveCanonical(type);
      }
      pTVar12 = type->canonical;
      if ((pTVar12->super_Symbol).kind == FixedSizeUnpackedArrayType) {
        iVar1 = (int)pTVar12[1].super_Symbol.name._M_len;
        iVar2 = *(int *)((long)&pTVar12[1].super_Symbol.name._M_len + 4);
        iVar15 = iVar1 - iVar2;
        if (iVar1 - iVar2 == 0 || iVar1 < iVar2) {
          iVar15 = -(iVar1 - iVar2);
        }
        uVar13 = CONCAT44(0,iVar15 + 1);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar13;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_48.multiplier;
        local_50 = SUB168(auVar5 * auVar7,0);
        bVar9 = SUB168(auVar5 * auVar7,8) != 0;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar13;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_48.fixed;
        uVar13 = SUB168(auVar6 * auVar8,0);
        bVar17 = SUB168(auVar6 * auVar8,8) != 0;
        if ((((bVar9) || (bVar17)) || (!bVar9 && 0x3fffffff8 < local_50)) ||
           (!bVar17 && 0x3fffffff8 < uVar13)) {
LAB_002969bc:
          __return_storage_ptr__->multiplier = 0;
          __return_storage_ptr__->fixed = 0;
          *(undefined8 *)&__return_storage_ptr__->isValid = 0;
          return __return_storage_ptr__;
        }
      }
      else if (mode == Source) {
        local_50 = std::__detail::__gcd<unsigned_long>(local_48.multiplier,local_48.fixed);
      }
      else {
        if (mode != DestFill) goto LAB_002969f4;
        local_50 = local_48.fixed;
        if (local_48.multiplier != 0) {
          uVar13 = local_48.fixed;
          local_50 = local_48.multiplier;
        }
      }
    }
    else {
      if (type->canonical == (Type *)0x0) {
        Type::resolveCanonical(type);
      }
      pTVar12 = type->canonical;
      if ((pTVar12->super_Symbol).kind == UnpackedStructType) {
        pTVar3 = pTVar12[1].canonical;
        if (pTVar3 != (Type *)0x0) {
          pSVar4 = pTVar12[1].super_Symbol.originatingSyntax;
          lVar16 = 0;
          local_50 = 0;
          do {
            pTVar12 = DeclaredType::getType
                                ((DeclaredType *)(*(long *)((long)&pSVar4->kind + lVar16) + 0x40));
            dynamicBitstreamSize(&local_48,pTVar12,mode);
            if (local_48.isValid == true) {
              BVar11 = mode;
              if (local_48.multiplier != 0) {
                BVar11 = DestEmpty;
              }
              if (mode == DestFill) {
                mode = BVar11;
              }
              local_50 = std::__detail::__gcd<unsigned_long>(local_50,local_48.multiplier);
              uVar13 = uVar13 + local_48.fixed;
              bVar9 = uVar13 < 0x3fffffff9;
            }
            else {
              bVar9 = false;
            }
            if (!bVar9) goto LAB_002969bc;
            lVar16 = lVar16 + 8;
          } while ((long)pTVar3 << 3 != lVar16);
          goto LAB_002969fd;
        }
      }
      else if ((pTVar12->super_Symbol).kind == ClassType) {
        sVar18 = Scope::membersOfType<slang::ast::ClassPropertySymbol>
                           ((Scope *)(type->canonical + 1));
        sVar14 = sVar18._M_begin.current;
        if (sVar14.current != sVar18._M_end.current.current) {
          local_50 = 0;
          do {
            pTVar12 = DeclaredType::getType((DeclaredType *)(sVar14.current + 1));
            dynamicBitstreamSize(&local_48,pTVar12,mode);
            if (local_48.isValid == true) {
              BVar11 = mode;
              if (local_48.multiplier != 0) {
                BVar11 = DestEmpty;
              }
              if (mode == DestFill) {
                mode = BVar11;
              }
              local_50 = std::__detail::__gcd<unsigned_long>(local_50,local_48.multiplier);
              uVar13 = uVar13 + local_48.fixed;
              bVar9 = uVar13 < 0x3fffffff9;
            }
            else {
              bVar9 = false;
            }
            if (!bVar9) goto LAB_002969bc;
            do {
              sVar14.current = (sVar14.current)->nextInScope;
              if (sVar14.current == (Symbol *)0x0) break;
            } while ((sVar14.current)->kind != ClassProperty);
          } while (sVar14.current != sVar18._M_end.current.current);
          goto LAB_002969fd;
        }
      }
LAB_002969f4:
      local_50 = 0;
    }
LAB_002969fd:
    __return_storage_ptr__->multiplier = local_50;
  }
  else {
    __return_storage_ptr__->multiplier = 0;
  }
  __return_storage_ptr__->fixed = uVar13;
LAB_00296762:
  __return_storage_ptr__->isValid = true;
  return __return_storage_ptr__;
}

Assistant:

static DynamicSize dynamicBitstreamSize(const Type& type, BitstreamSizeMode mode) {
    uint64_t multiplier = 0;
    uint64_t fixedSize = type.getBitWidth();
    if (fixedSize > 0)
        return {0, fixedSize};

    if (type.isString())
        return {mode == BitstreamSizeMode::DestEmpty ? 0u : CHAR_BIT, 0u};

    auto handleField = [&](const ValueSymbol& field) {
        auto elemSize = dynamicBitstreamSize(field.getType(), mode);
        if (!elemSize)
            return false;

        // If a dynamically sized field is filled the rest should be empty.
        if (mode == BitstreamSizeMode::DestFill && elemSize.multiplier > 0)
            mode = BitstreamSizeMode::DestEmpty;

        multiplier = std::gcd(multiplier, elemSize.multiplier);
        fixedSize += elemSize.fixed;
        if (fixedSize > Type::MaxBitWidth)
            return false;

        return true;
    };

    if (type.isUnpackedArray()) {
        auto elemSize = dynamicBitstreamSize(*type.getArrayElementType(), mode);
        if (!elemSize)
            return elemSize;

        const auto& ct = type.getCanonicalType();
        if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType) {
            auto rw = ct.as<FixedSizeUnpackedArrayType>().range.width();
            auto mul = checkedMulU64(elemSize.multiplier, rw);
            auto fixed = checkedMulU64(elemSize.fixed, rw);
            if (!mul || !fixed || mul > Type::MaxBitWidth || fixed > Type::MaxBitWidth)
                return {};

            multiplier = *mul;
            fixedSize = *fixed;
        }
        else if (mode == BitstreamSizeMode::DestFill) {
            if (!elemSize.multiplier) {
                multiplier = elemSize.fixed; // element is fixed size
            }
            else {
                multiplier = elemSize.multiplier; // element is dynamically sized
                fixedSize = elemSize.fixed;
            }
        }
        else if (mode == BitstreamSizeMode::Source) {
            multiplier = std::gcd(elemSize.multiplier, elemSize.fixed);
        }
    }
    else if (type.isUnpackedStruct()) {
        auto& us = type.getCanonicalType().as<UnpackedStructType>();
        for (auto field : us.fields) {
            if (!handleField(*field))
                return {};
        }
    }
    else if (type.isClass()) {
        auto& ct = type.getCanonicalType().as<ClassType>();
        SLANG_ASSERT(!ct.hasCycles());
        for (auto& prop : ct.membersOfType<ClassPropertySymbol>()) {
            if (!handleField(prop))
                return {};
        }
    }

    return {multiplier, fixedSize};
}